

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkingDirectory.cxx
# Opt level: O3

void __thiscall cmWorkingDirectory::~cmWorkingDirectory(cmWorkingDirectory *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  if ((this->OldDir)._M_string_length != 0) {
    cmsys::SystemTools::ChangeDirectory(&this->OldDir);
    (this->OldDir)._M_string_length = 0;
    *(this->OldDir)._M_dataplus._M_p = '\0';
  }
  pcVar1 = (this->OldDir)._M_dataplus._M_p;
  paVar2 = &(this->OldDir).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmWorkingDirectory::~cmWorkingDirectory()
{
  this->Pop();
}